

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::Normalizer2Impl::decompose
          (Normalizer2Impl *this,UnicodeString *src,UnicodeString *dest,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t destLengthEstimate;
  char16_t *src_00;
  UChar *sArray;
  UErrorCode *errorCode_local;
  UnicodeString *dest_local;
  UnicodeString *src_local;
  Normalizer2Impl *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    src_00 = UnicodeString::getBuffer(src);
    if ((dest == src) || (src_00 == (char16_t *)0x0)) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      UnicodeString::setToBogus(dest);
    }
    else {
      iVar2 = UnicodeString::length(src);
      destLengthEstimate = UnicodeString::length(src);
      decompose(this,src_00,src_00 + iVar2,dest,destLengthEstimate,errorCode);
    }
  }
  else {
    UnicodeString::setToBogus(dest);
  }
  return dest;
}

Assistant:

UnicodeString &
Normalizer2Impl::decompose(const UnicodeString &src, UnicodeString &dest,
                           UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        dest.setToBogus();
        return dest;
    }
    const UChar *sArray=src.getBuffer();
    if(&dest==&src || sArray==NULL) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        dest.setToBogus();
        return dest;
    }
    decompose(sArray, sArray+src.length(), dest, src.length(), errorCode);
    return dest;
}